

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O0

int USHAFinalBits(USHAContext *ctx,uint8_t bits,uint bitcount)

{
  uint bitcount_local;
  uint8_t bits_local;
  USHAContext *ctx_local;
  
  if (ctx == (USHAContext *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else {
    switch(ctx->whichSha) {
    case 0:
      ctx_local._4_4_ = SHA1FinalBits(&(ctx->ctx).sha1Context,bits,bitcount);
      break;
    case 1:
      ctx_local._4_4_ = SHA224FinalBits(&(ctx->ctx).sha224Context,bits,bitcount);
      break;
    case 2:
      ctx_local._4_4_ = SHA256FinalBits(&(ctx->ctx).sha256Context,bits,bitcount);
      break;
    case 3:
      ctx_local._4_4_ = SHA384FinalBits(&(ctx->ctx).sha384Context,bits,bitcount);
      break;
    case 4:
      ctx_local._4_4_ = SHA512FinalBits(&(ctx->ctx).sha512Context,bits,bitcount);
      break;
    default:
      ctx_local._4_4_ = 4;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int USHAFinalBits(USHAContext *ctx,
const uint8_t bits, unsigned int bitcount)
{
    if (ctx) {
        switch (ctx->whichSha) {
        case SHA1:
            return SHA1FinalBits((SHA1Context*)&ctx->ctx, bits, bitcount);
        case SHA224:
            return SHA224FinalBits((SHA224Context*)&ctx->ctx, bits,
                bitcount);
        case SHA256:
            return SHA256FinalBits((SHA256Context*)&ctx->ctx, bits,
                bitcount);
        case SHA384:
            return SHA384FinalBits((SHA384Context*)&ctx->ctx, bits,
                bitcount);
        case SHA512:
            return SHA512FinalBits((SHA512Context*)&ctx->ctx, bits,
                bitcount);
        default: return shaBadParam;
        }
    }
    else {
        return shaNull;
    }
}